

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

vec6F * __thiscall
crnlib::dxt_hc::palettize_color
          (vec6F *__return_storage_ptr__,dxt_hc *this,color_quad_u8 *pixels,uint pixels_count)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  uint size;
  ulong uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  vec3F result [2];
  vec<3U,_float> temp;
  uint color [64];
  uint weights [64];
  vec3F vectors [64];
  vec<3U,_float> local_558;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  uint uStack_52c;
  uint local_528 [64];
  uint local_428 [64];
  vec<3U,_float> local_328 [64];
  
  if (pixels_count != 0) {
    uVar7 = (ulong)pixels_count;
    uVar6 = 0;
    do {
      *(uint *)((long)local_528 + uVar6 * 4) =
           (uint)pixels[uVar6].field_0.field_0.b |
           (uint)pixels[uVar6].field_0.field_0.g << 8 |
           (uint)pixels[uVar6].field_0.field_0.r << 0x10;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
    if (pixels_count != 0) {
      lVar8 = (long)local_528 + uVar7 * 4;
      lVar3 = 0x3f;
      if (uVar7 != 0) {
        for (; pixels_count >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_528,lVar8,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(local_528,lVar8);
      bVar1 = (this->m_params).m_perceptual;
      uVar6 = 0;
      size = 0;
      do {
        if ((uVar6 == 0) || (*(uint *)((long)local_528 + uVar6 * 4) != (&uStack_52c)[uVar6])) {
          uVar2 = *(uint *)((long)local_528 + uVar6 * 4);
          if ((bVar1 & 1U) == 0) {
            local_328[size].m_s[0] = this->m_uint8_to_float[uVar2 >> 0x10];
            local_328[size].m_s[1] = this->m_uint8_to_float[uVar2 >> 8 & 0xff];
            fVar13 = this->m_uint8_to_float[uVar2 & 0xff];
          }
          else {
            local_328[size].m_s[0] = this->m_uint8_to_float[uVar2 >> 0x10] * 0.5;
            local_328[size].m_s[1] = this->m_uint8_to_float[uVar2 >> 8 & 0xff];
            fVar13 = this->m_uint8_to_float[uVar2 & 0xff] * 0.25;
          }
          local_328[size].m_s[2] = fVar13;
          local_428[size] = 1;
          size = size + 1;
        }
        else {
          local_428[size - 1] = local_428[size - 1] + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
      goto LAB_00175ea7;
    }
  }
  size = 0;
LAB_00175ea7:
  split_vectors<crnlib::vec<3u,float>>
            (&local_328,&local_428,size,(vec<3U,_float> (*) [2])&local_558);
  fVar5 = local_558.m_s[2];
  fVar4 = local_558.m_s[1];
  fVar13 = local_558.m_s[0];
  auVar11._0_4_ = local_558.m_s[1] * local_558.m_s[1] + local_558.m_s[0] * local_558.m_s[0];
  auVar11._4_4_ = fStack_548 * fStack_548 + fStack_54c * fStack_54c;
  auVar11._8_4_ = local_558.m_s[2] * local_558.m_s[2] + local_558.m_s[2] * local_558.m_s[2];
  auVar11._12_4_ = fStack_544 * fStack_544 + fStack_54c * fStack_54c;
  fVar9 = local_558.m_s[2] * local_558.m_s[2] + auVar11._0_4_;
  fVar10 = fStack_544 * fStack_544 + auVar11._4_4_;
  auVar12._4_4_ = fVar10;
  auVar12._0_4_ = fVar9;
  auVar12._8_4_ = auVar11._8_4_ + 0.0;
  auVar12._12_4_ = auVar11._12_4_ + 0.0;
  auVar12 = rsqrtps(auVar11,auVar12);
  fVar14 = fVar9 * auVar12._0_4_;
  fVar15 = fVar10 * auVar12._4_4_;
  if ((float)(-(uint)(1.1754944e-38 <= ABS(fVar10)) &
             (uint)((fVar15 * auVar12._4_4_ + -3.0) * fVar15 * -0.5)) <
      (float)(-(uint)(1.1754944e-38 <= ABS(fVar9)) &
             (uint)((fVar14 * auVar12._0_4_ + -3.0) * fVar14 * -0.5))) {
    local_558.m_s[2] = fStack_544;
    local_558.m_s[0] = fStack_54c;
    local_558.m_s[1] = fStack_548;
    fStack_54c = fVar13;
    fStack_548 = fVar4;
    fStack_544 = fVar5;
  }
  *(ulong *)(__return_storage_ptr__->m_s + 4) = CONCAT44(fStack_544,fStack_548);
  *(ulong *)__return_storage_ptr__->m_s = CONCAT44(local_558.m_s[1],local_558.m_s[0]);
  *(ulong *)(__return_storage_ptr__->m_s + 2) = CONCAT44(fStack_54c,local_558.m_s[2]);
  return __return_storage_ptr__;
}

Assistant:

vec6F dxt_hc::palettize_color(color_quad_u8* pixels, uint pixels_count) {
  uint color[64];
  for (uint i = 0; i < pixels_count; i++)
    color[i] = pixels[i][0] << 16 | pixels[i][1] << 8 | pixels[i][2];
  std::sort(color, color + pixels_count);
  vec3F vectors[64];
  uint weights[64];
  uint size = 0;
  for (uint i = 0; i < pixels_count; i++) {
    if (!i || color[i] != color[i - 1]) {
      vectors[size][0] = m_params.m_perceptual ? m_uint8_to_float[color[i] >> 16] * 0.5f : m_uint8_to_float[color[i] >> 16];
      vectors[size][1] = m_uint8_to_float[color[i] >> 8 & 0xFF];
      vectors[size][2] = m_params.m_perceptual ? m_uint8_to_float[color[i] & 0xFF] * 0.25f : m_uint8_to_float[color[i] & 0xFF];
      weights[size] = 1;
      size++;
    } else {
      weights[size - 1]++;
    }
  }
  vec3F result[2];
  split_vectors<vec3F>(vectors, weights, size, result);
  if (result[0].length() > result[1].length())
    utils::swap(result[0], result[1]);
  return *(vec6F*)result;
}